

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O0

IdentPtr __thiscall
HashTbl::FindExistingPid<char16_t>
          (HashTbl *this,char16_t *prgch,char16_t *end,int32 cch,uint32 luHash,IdentPtr **pppInsert,
          int32 *pBucketCount,int *depth)

{
  IdentPtr pIVar1;
  bool bVar2;
  IdentPtr local_50;
  IdentPtr *ppid;
  IdentPtr pid;
  int32 bucketCount;
  IdentPtr **pppInsert_local;
  uint32 luHash_local;
  int32 cch_local;
  char16_t *end_local;
  char16_t *prgch_local;
  HashTbl *this_local;
  
  pid._4_4_ = 0;
  local_50 = (IdentPtr)(this->m_prgpidName + (luHash & this->m_luMask));
  while( true ) {
    pIVar1 = local_50->m_pidNext;
    if (pIVar1 == (IdentPtr)0x0) {
      if (pBucketCount != (int32 *)0x0) {
        *pBucketCount = pid._4_4_;
      }
      if (pppInsert != (IdentPtr **)0x0) {
        *pppInsert = &local_50->m_pidNext;
      }
      return (IdentPtr)0x0;
    }
    if (((pIVar1->m_luHash == luHash) && (pIVar1->m_cch == cch)) &&
       (bVar2 = CharsAreEqual((LPCOLESTR)&pIVar1->field_0x22,prgch,end), bVar2)) break;
    *depth = *depth + 1;
    pid._4_4_ = pid._4_4_ + 1;
    local_50 = pIVar1;
  }
  return pIVar1;
}

Assistant:

IdentPtr HashTbl::FindExistingPid(
    CharType const * prgch,
    CharType const * end,
    int32 cch,
    uint32 luHash,
    IdentPtr **pppInsert,
    int32 *pBucketCount
#if PROFILE_DICTIONARY
    , int& depth
#endif
    )
{
    int32 bucketCount;
    IdentPtr pid;

    /* Search the hash table for an existing match */
    IdentPtr *ppid = &m_prgpidName[luHash & m_luMask];
    for (bucketCount = 0; nullptr != (pid = *ppid); ppid = &pid->m_pidNext, bucketCount++)
    {
        if (pid->m_luHash == luHash && (int)pid->m_cch == cch &&
            HashTbl::CharsAreEqual(pid->m_sz, prgch, end))
        {
            return pid;
        }
#if PROFILE_DICTIONARY
        ++depth;
#endif
    }

    if (pBucketCount)
    {
        *pBucketCount = bucketCount;
    }
    if (pppInsert)
    {
        *pppInsert = ppid;
    }

    return nullptr;
}